

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O3

bool ON_OrderEdgesAroundVertex(ON_Brep *B,int vid,ON_2dex *trim_ends,bool *bClosed)

{
  long lVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ON_BrepVertex *pOVar5;
  uint *puVar6;
  byte bVar7;
  bool bVar8;
  uint uVar9;
  ON_BrepEdge *pOVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ON_BrepTrim *this;
  
  *bClosed = false;
  if (-1 < vid) {
    pOVar5 = (B->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_a;
    if (-1 < pOVar5[(uint)vid].m_vertex_index) {
      *bClosed = true;
      lVar12 = (long)pOVar5[(uint)vid].m_ei.m_count;
      if (0 < lVar12) {
        lVar13 = 0;
        do {
          iVar2 = (B->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a
                  [pOVar5[(uint)vid].m_ei.m_a[lVar13]].m_ti.m_count;
          if (iVar2 != 2) {
            if (iVar2 != 1) {
              return false;
            }
            *bClosed = false;
            bVar8 = OrderEdgesAroundOpenVertex(B,vid,trim_ends);
            return bVar8;
          }
          lVar13 = lVar13 + 1;
        } while (lVar12 != lVar13);
        iVar2 = *pOVar5[(uint)vid].m_ei.m_a;
        pOVar10 = (B->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
        if (pOVar10[iVar2].m_ti.m_count == 2) {
          iVar3 = *pOVar10[iVar2].m_ti.m_a;
          lVar13 = (long)iVar3;
          trim_ends->i = iVar3;
          bVar7 = pOVar10[iVar2].m_vi[0] != vid ^
                  (B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a
                  [lVar13].m_bRev3d;
          uVar9 = (uint)bVar7;
          trim_ends->j = (uint)bVar7;
          lVar12 = 0;
          while( true ) {
            if (uVar9 == 0) {
              uVar9 = ON_Brep::PrevNonsingularTrim(B,(int)lVar13);
            }
            else {
              uVar9 = ON_Brep::NextNonsingularTrim(B,(int)lVar13);
            }
            if ((int)uVar9 < 0) break;
            this = (B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a +
                   uVar9;
            pOVar10 = ON_BrepTrim::Edge(this);
            if (pOVar10 == (ON_BrepEdge *)0x0) {
              return false;
            }
            if ((pOVar10->m_ti).m_count != 2) {
              return false;
            }
            lVar1 = lVar12 + 1;
            puVar6 = (uint *)(pOVar10->m_ti).m_a;
            uVar4 = puVar6[*puVar6 == uVar9];
            lVar13 = (long)(int)uVar4;
            uVar9 = 1 - trim_ends[lVar12].j;
            if ((B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a
                [lVar13].m_bRev3d != this->m_bRev3d) {
              uVar9 = trim_ends[lVar12].j;
            }
            if ((uVar4 == trim_ends->i) && (uVar9 == trim_ends->j)) {
              return pOVar5[(uint)vid].m_ei.m_count == (int)lVar1;
            }
            if (lVar12 != 0) {
              lVar11 = 0;
              do {
                if ((uVar4 == trim_ends[lVar11 + 1].i) && (uVar9 == trim_ends[lVar11 + 1].j)) {
                  return false;
                }
                lVar11 = lVar11 + 1;
              } while (lVar12 != lVar11);
            }
            trim_ends[lVar1].i = uVar4;
            trim_ends[lVar1].j = uVar9;
            lVar12 = lVar1;
            if (pOVar5[(uint)vid].m_ei.m_count <= lVar1) {
              return false;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_OrderEdgesAroundVertex(const ON_Brep& B, int vid,
                               ON_2dex* trim_ends,//Must be at as big as the edge count at the vertex
                               bool& bClosed)

{
  bClosed = false;
  if (vid<0)
    return false;
  const ON_BrepVertex& V = B.m_V[vid];
  if (V.m_vertex_index < 0)
    return false;
  int i;
  bClosed = true;
  for (i=0; i<V.m_ei.Count(); i++){
    const ON_BrepEdge& E = B.m_E[V.m_ei[i]];
    if (E.m_ti.Count() == 2)
      continue;
    if (E.m_ti.Count() == 1){
      bClosed = false;
      break;
    }
    return false;
  }
  return (bClosed) ? 
    OrderEdgesAroundClosedVertex(B, vid, trim_ends) : OrderEdgesAroundOpenVertex(B, vid, trim_ends);
}